

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void __thiscall
util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
          (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *this,
          dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *other)

{
  uint uVar1;
  pointer pvVar2;
  pointer pvVar3;
  uint *puVar4;
  long lVar5;
  allocator_type my_alloc;
  new_allocator<unsigned_int> local_11;
  
  this->_vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
  uVar1 = other->elem_count;
  this->elem_count = uVar1;
  this->elems = (pointer)0x0;
  if ((ulong)uVar1 != 0) {
    puVar4 = __gnu_cxx::new_allocator<unsigned_int>::allocate(&local_11,(ulong)uVar1,(void *)0x0);
    this->elems = puVar4;
  }
  uVar1 = this->elem_count;
  if ((ulong)uVar1 != 0) {
    pvVar2 = other->elems;
    pvVar3 = this->elems;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)pvVar3 + lVar5) = *(undefined4 *)((long)pvVar2 + lVar5);
      lVar5 = lVar5 + 4;
    } while ((ulong)uVar1 << 2 != lVar5);
  }
  return;
}

Assistant:

constexpr dynamic_array(const dynamic_array& other)
      : elem_count(other.size())
    {
      allocator_type my_alloc;

      if(elem_count > static_cast<size_type>(UINT8_C(0)))
      {
        elems = std::allocator_traits<allocator_type>::allocate(my_alloc, elem_count);
      }

      #if defined(WIDE_INTEGER_NAMESPACE)
      WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::copy_unsafe(other.elems, other.elems + elem_count, elems);
      #else
      ::math::wide_integer::detail::copy_unsafe(other.elems, other.elems + elem_count, elems);
      #endif
    }